

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O0

vector<const_kratos::Stmt_*,_std::allocator<const_kratos::Stmt_*>_> *
kratos::extract_debug_break_points
          (vector<const_kratos::Stmt_*,_std::allocator<const_kratos::Stmt_*>_>
           *__return_storage_ptr__,Generator *top)

{
  vector<const_kratos::Stmt_*,_std::allocator<const_kratos::Stmt_*>_> *__x;
  undefined1 local_78 [8];
  ExtractDebugVisitor visitor;
  Generator *top_local;
  
  visitor.stmts_.super__Vector_base<const_kratos::Stmt_*,_std::allocator<const_kratos::Stmt_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)top;
  ExtractDebugVisitor::ExtractDebugVisitor((ExtractDebugVisitor *)local_78);
  IRVisitor::visit_root
            ((IRVisitor *)local_78,
             (IRNode *)
             visitor.stmts_.
             super__Vector_base<const_kratos::Stmt_*,_std::allocator<const_kratos::Stmt_*>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage);
  __x = ExtractDebugVisitor::stmts((ExtractDebugVisitor *)local_78);
  std::vector<const_kratos::Stmt_*,_std::allocator<const_kratos::Stmt_*>_>::vector
            (__return_storage_ptr__,__x);
  ExtractDebugVisitor::~ExtractDebugVisitor((ExtractDebugVisitor *)local_78);
  return __return_storage_ptr__;
}

Assistant:

std::vector<const Stmt *> extract_debug_break_points(Generator *top) {
    ExtractDebugVisitor visitor;
    visitor.visit_root(top);
    return visitor.stmts();
}